

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysp_when * lysp_node_when(lysp_node *node)

{
  lysp_when **pplVar1;
  lysp_when **when;
  lysp_node *node_local;
  
  pplVar1 = lysp_node_when_p(node);
  if (pplVar1 == (lysp_when **)0x0) {
    node_local = (lysp_node *)0x0;
  }
  else {
    node_local = (lysp_node *)*pplVar1;
  }
  return (lysp_when *)node_local;
}

Assistant:

struct lysp_when *
lysp_node_when(const struct lysp_node *node)
{
    struct lysp_when **when;

    when = lysp_node_when_p(node);
    if (when) {
        return *when;
    } else {
        return NULL;
    }
}